

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::assign(IEEEFloat *this,IEEEFloat *rhs)

{
  bool bVar1;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  if (this->semantics == rhs->semantics) {
    this->field_0x12 = this->field_0x12 & 0xf7 | ((byte)rhs->field_0x12 >> 3 & 1) << 3;
    this->field_0x12 = this->field_0x12 & 0xf8 | rhs->field_0x12 & 7;
    this->exponent = rhs->exponent;
    bVar1 = isFiniteNonZero(this);
    if ((bVar1) || ((this->field_0x12 & 7) == 1)) {
      copySignificand(this,rhs);
    }
    return;
  }
  __assert_fail("semantics == rhs.semantics",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x29e,"void llvm::detail::IEEEFloat::assign(const IEEEFloat &)");
}

Assistant:

void IEEEFloat::assign(const IEEEFloat &rhs) {
  assert(semantics == rhs.semantics);

  sign = rhs.sign;
  category = rhs.category;
  exponent = rhs.exponent;
  if (isFiniteNonZero() || category == fcNaN)
    copySignificand(rhs);
}